

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::RegisterTestSuite
          (TypeParameterizedTestSuiteRegistry *this,char *test_suite_name,
          CodeLocation *code_location)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
  *in_RDI;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  TypeParameterizedTestSuiteInfo *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (allocator<char> *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50));
  CodeLocation::CodeLocation
            (&in_stack_ffffffffffffff20->code_location,
             (CodeLocation *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  TypeParameterizedTestSuiteInfo::TypeParameterizedTestSuiteInfo
            (in_stack_ffffffffffffff20,
             (CodeLocation *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  std::
  map<std::__cxx11::string,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>>
  ::
  emplace<std::__cxx11::string,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
            (in_RDI,in_RDX,in_stack_ffffffffffffff20);
  TypeParameterizedTestSuiteInfo::~TypeParameterizedTestSuiteInfo
            ((TypeParameterizedTestSuiteInfo *)0x167f39);
  CodeLocation::~CodeLocation((CodeLocation *)0x167f43);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::RegisterTestSuite(
    const char* test_suite_name, CodeLocation code_location) {
  suites_.emplace(std::string(test_suite_name),
                 TypeParameterizedTestSuiteInfo(code_location));
}